

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O1

void __thiscall QWidget::setFixedSize(QWidget *this,int w,int h)

{
  QWidgetPrivate *this_00;
  bool bVar1;
  bool bVar2;
  long in_FS_OFFSET;
  int local_40;
  int local_3c;
  QSize local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidgetPrivate **)&this->field_0x8;
  local_40 = h;
  local_3c = w;
  bVar1 = QWidgetPrivate::setMinimumSize_helper(this_00,&local_3c,&local_40);
  bVar2 = QWidgetPrivate::setMaximumSize_helper(this_00,&local_3c,&local_40);
  if ((bVar1) || (bVar2)) {
    if (((this->data->window_flags).super_QFlagsStorageHelper<Qt::WindowType,_4>.
         super_QFlagsStorage<Qt::WindowType>.i & 1) == 0) {
      QWidgetPrivate::updateGeometry_helper(this_00,true);
    }
    else {
      QWidgetPrivate::setConstraints_sys(this_00);
    }
    if (local_40 != 0xffffff || local_3c != 0xffffff) {
      local_38.wd.m_i = local_3c;
      local_38.ht.m_i = local_40;
      resize(this,&local_38);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidget::setFixedSize(int w, int h)
{
    Q_D(QWidget);
    bool minSizeSet = d->setMinimumSize_helper(w, h);
    bool maxSizeSet = d->setMaximumSize_helper(w, h);
    if (!minSizeSet && !maxSizeSet)
        return;

    if (isWindow())
        d->setConstraints_sys();
    else
        d->updateGeometry_helper(true);

    if (w != QWIDGETSIZE_MAX || h != QWIDGETSIZE_MAX)
        resize(w, h);
}